

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O2

Vec3 OpenSteer::randomVectorOnUnitRadiusXZDisk(void)

{
  Vec3 VVar1;
  float fVar2;
  Vec3 local_18;
  float local_c;
  
  local_18.x = 0.0;
  local_18.y = 0.0;
  local_18.z = 0.0;
  do {
    fVar2 = frandom01();
    local_c = fVar2 + fVar2 + -1.0;
    fVar2 = frandom01();
    local_18.z = fVar2 + fVar2 + -1.0;
    local_18.x = local_c;
    local_18.y = 0.0;
    fVar2 = Vec3::length(&local_18);
  } while (1.0 <= fVar2);
  VVar1.y = local_18.y;
  VVar1.x = local_18.x;
  VVar1.z = local_18.z;
  return VVar1;
}

Assistant:

OpenSteer::Vec3 
OpenSteer::randomVectorOnUnitRadiusXZDisk (void)
{
    Vec3 v;

    do
    {
        v.set ((frandom01()*2) - 1,
               0,
               (frandom01()*2) - 1);
    }
    while (v.length() >= 1);

    return v;
}